

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O3

uint64_t bloaty::dwarf::ReadLEB128Internal(bool is_signed,string_view *data)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  
  sVar5 = data->_M_len;
  pbVar8 = (byte *)data->_M_str;
  pbVar1 = pbVar8 + sVar5;
  uVar4 = 0xfffffffffffffff9;
  uVar3 = 0;
  while ((pbVar8 < pbVar1 && (uVar4 = uVar4 + 7, uVar4 < 0x46))) {
    bVar2 = *pbVar8;
    pbVar8 = pbVar8 + 1;
    uVar3 = uVar3 | (ulong)(bVar2 & 0x7f) << ((byte)uVar4 & 0x3f);
    sVar5 = sVar5 - 1;
    if (-1 < (char)bVar2) {
      data->_M_str = (char *)pbVar8;
      data->_M_len = sVar5;
      uVar7 = 0;
      uVar6 = -0x80L << ((byte)uVar4 & 0x3f);
      if (bVar2 < 0x40) {
        uVar6 = uVar7;
      }
      if (0x38 < uVar4) {
        uVar6 = uVar7;
      }
      if (!is_signed) {
        uVar6 = uVar7;
      }
      return uVar3 | uVar6;
    }
  }
  Throw("corrupt DWARF data, unterminated LEB128",0x35);
}

Assistant:

uint64_t ReadLEB128Internal(bool is_signed, string_view* data) {
  uint64_t ret = 0;
  int shift = 0;
  int maxshift = 70;
  const char* ptr = data->data();
  const char* limit = ptr + data->size();

  while (ptr < limit && shift < maxshift) {
    char byte = *(ptr++);
    ret |= static_cast<uint64_t>(byte & 0x7f) << shift;
    shift += 7;
    if ((byte & 0x80) == 0) {
      data->remove_prefix(ptr - data->data());
      if (is_signed && shift < 64 && (byte & 0x40)) {
        ret |= -(1ULL << shift);
      }
      return ret;
    }
  }

  THROW("corrupt DWARF data, unterminated LEB128");
}